

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd.h
# Opt level: O0

void ncnn::conv3x3s1_winograd43(Mat *bottom_blob,Mat *top_blob,Mat *AT,Mat *bias,int nT,Option *opt)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  Mat BT_tile_2;
  Mat AT_tile;
  int max_kk_2;
  int k_2;
  int max_jj_2;
  int j_2;
  int max_ii;
  Mat top_tile;
  int i;
  int ppj_2;
  Mat top_tileX;
  Mat BT_tile_1;
  Mat B_tile_1;
  Mat *in_stack_00000488;
  int max_kk_1;
  int max_jj_1;
  int k_1;
  int j_1;
  int ppk_1;
  int ppj_1;
  int ppjk_1;
  Mat B_tileX;
  Mat BT_tile;
  int max_kk;
  int max_jj;
  int k;
  int j;
  int ppk;
  int ppj;
  int ppjk;
  Mat B_tile;
  int nn_NK;
  Mat BT;
  int nn_K;
  int nn_N;
  int nn_M;
  int TILE_K;
  int TILE_N;
  int TILE_M;
  int B;
  int K;
  int N;
  int M;
  int tiles;
  int h_tiles;
  int w_tiles;
  int outh;
  int outw;
  int in_stack_000008d0;
  int in_stack_000008d4;
  int in_stack_000008d8;
  int in_stack_000008dc;
  Mat *in_stack_000008e0;
  Mat *in_stack_000008e8;
  Mat *m_5;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  Mat *m_4;
  int in_stack_fffffffffffff110;
  int in_stack_fffffffffffff118;
  undefined4 in_stack_fffffffffffff11c;
  int in_stack_fffffffffffff120;
  int in_stack_fffffffffffff124;
  size_t in_stack_fffffffffffff128;
  void **ppvVar4;
  Mat *in_stack_fffffffffffff130;
  int in_stack_fffffffffffff138;
  int in_stack_fffffffffffff13c;
  Mat *in_stack_fffffffffffff140;
  int *in_stack_fffffffffffff180;
  int *in_stack_fffffffffffff188;
  Allocator *in_stack_fffffffffffff190;
  undefined8 in_stack_fffffffffffff198;
  undefined8 in_stack_fffffffffffff1a0;
  int in_stack_fffffffffffff1b0;
  undefined8 local_d20;
  undefined8 local_d18;
  undefined8 local_d10;
  undefined4 local_d08;
  long *local_d00;
  undefined4 local_cf8;
  undefined4 local_cf4;
  undefined4 local_cf0;
  undefined4 local_cec;
  undefined4 local_ce8;
  undefined8 local_ce0;
  void *local_cd8;
  int *local_cd0;
  long local_cc8;
  undefined4 local_cc0;
  long *local_cb8;
  undefined4 local_cb0;
  int local_cac;
  int local_ca8;
  undefined4 local_ca4;
  undefined4 local_ca0;
  long local_c98;
  undefined8 local_c90;
  undefined8 local_c88;
  undefined8 local_c80;
  undefined4 local_c78;
  long *local_c70;
  undefined4 local_c68;
  undefined4 local_c64;
  undefined4 local_c60;
  undefined4 local_c5c;
  undefined4 local_c58;
  undefined8 local_c50;
  void *local_c48;
  int *local_c40;
  long local_c38;
  undefined4 local_c30;
  long *local_c28;
  undefined4 local_c20;
  int local_c1c;
  int local_c18;
  undefined4 local_c14;
  undefined4 local_c10;
  long local_c08;
  int local_c00;
  int local_bfc;
  int local_bf8;
  int local_bf4;
  int local_bf0;
  int local_bec;
  int local_be8;
  int local_be4;
  void *local_be0;
  int *local_bd8;
  ulong local_bd0;
  undefined4 local_bc8;
  long *local_bc0;
  int local_bb8;
  int local_bb4;
  int local_bb0;
  undefined4 local_bac;
  undefined4 local_ba8;
  ulong local_ba0;
  int local_b98;
  int local_b94;
  void *local_b90;
  int *local_b88;
  ulong local_b80;
  undefined4 local_b78;
  long *local_b70;
  int local_b68;
  int local_b64;
  int local_b60;
  undefined4 local_b5c;
  undefined4 local_b58;
  long local_b50;
  undefined8 local_b48;
  undefined8 local_b40;
  undefined8 local_b38;
  undefined4 local_b30;
  long *local_b28;
  undefined4 local_b20;
  undefined4 local_b1c;
  undefined4 local_b18;
  undefined4 local_b14;
  undefined4 local_b10;
  undefined8 local_b08;
  void *local_b00;
  int *local_af8;
  long local_af0;
  undefined4 local_ae8;
  long *local_ae0;
  undefined4 local_ad8;
  int local_ad4;
  int local_ad0;
  undefined4 local_acc;
  undefined4 local_ac8;
  long local_ac0;
  void *local_ab8;
  int *local_ab0;
  ulong local_aa8;
  undefined4 local_aa0;
  long *local_a98;
  int local_a90;
  int local_a8c;
  int local_a88;
  undefined4 local_a84;
  undefined4 local_a80;
  ulong local_a78;
  int local_a6c;
  int local_a68;
  int local_a64;
  int local_a60;
  int local_a5c;
  int local_a58;
  int local_a54;
  int local_a50;
  int local_a4c;
  void *local_a48;
  int *local_a40;
  ulong local_a38;
  undefined4 local_a30;
  long *local_a28;
  int local_a20;
  int local_a1c;
  int local_a18;
  undefined4 local_a14;
  undefined4 local_a10;
  long local_a08;
  undefined8 local_a00;
  undefined8 local_9f8;
  undefined8 local_9f0;
  undefined4 local_9e8;
  long *local_9e0;
  undefined4 local_9d8;
  undefined4 local_9d4;
  undefined4 local_9d0;
  undefined4 local_9cc;
  undefined4 local_9c8;
  undefined8 local_9c0;
  void *local_9b8;
  int *local_9b0;
  long local_9a8;
  undefined4 local_9a0;
  long *local_998;
  undefined4 local_990;
  int local_98c;
  int local_988;
  undefined4 local_984;
  undefined4 local_980;
  long local_978;
  int local_970;
  int local_96c;
  int local_968;
  int local_964;
  int local_960;
  int local_95c;
  int local_958;
  int local_954;
  int local_950;
  void *local_940;
  int *local_938;
  undefined8 local_930;
  undefined4 local_928;
  long *local_920;
  undefined4 local_918;
  undefined4 local_914;
  undefined4 local_910;
  undefined4 local_90c;
  undefined4 local_908;
  undefined8 local_900;
  int local_8f4;
  void *local_8f0;
  int *local_8e8;
  long local_8e0;
  undefined4 local_8d8;
  long *local_8d0;
  undefined4 local_8c8;
  int local_8c4;
  int local_8c0;
  undefined4 local_8bc;
  undefined4 local_8b8;
  long local_8b0;
  int local_8a4;
  int local_8a0;
  int local_89c;
  int local_898;
  int local_894;
  int local_890 [3];
  int local_884;
  int local_880;
  int local_87c;
  int local_878;
  int local_874;
  int local_870;
  int local_86c;
  int local_85c;
  long *local_850;
  undefined8 *local_838;
  void **local_828;
  void **local_818;
  undefined8 *local_808;
  void **local_7f8;
  void **local_7e8;
  void **local_7d8;
  undefined8 *local_7c8;
  undefined8 *local_7b8;
  void **local_7a8;
  void **local_798;
  void **local_788;
  int in_stack_fffffffffffff880;
  int in_stack_fffffffffffff884;
  undefined8 in_stack_fffffffffffff888;
  Mat *in_stack_fffffffffffff890;
  Mat *in_stack_fffffffffffff898;
  
  local_86c = *(int *)(in_RSI + 0x2c);
  local_870 = *(int *)(in_RSI + 0x30);
  local_874 = (local_86c + 3) / 4;
  local_878 = (local_870 + 3) / 4;
  local_884 = local_874 * local_878;
  local_880 = *(int *)(in_RSI + 0x38) * *(int *)(in_RSI + 0x18);
  local_890[2] = *(int *)(in_RDI + 0x38) * *(int *)(in_RDI + 0x18);
  local_890[1] = 0x24;
  local_87c = local_884;
  local_85c = in_R8D;
  local_850 = in_RDX;
  get_optimal_tile_mnk
            ((int)((ulong)in_stack_fffffffffffff1a0 >> 0x20),(int)in_stack_fffffffffffff1a0,
             (int)((ulong)in_stack_fffffffffffff198 >> 0x20),(int *)in_stack_fffffffffffff190,
             in_stack_fffffffffffff188,in_stack_fffffffffffff180,in_stack_fffffffffffff1b0);
  local_89c = (local_880 + local_890[0] + -1) / local_890[0];
  local_8a0 = (local_884 + local_894 + -1) / local_894;
  local_8a4 = (local_890[2] + local_898 + -1) / local_898;
  local_8f0 = (void *)0x0;
  local_8e8 = (int *)0x0;
  local_8e0 = 0;
  local_8d8 = 0;
  local_8d0 = (long *)0x0;
  local_8c8 = 0;
  local_8c4 = 0;
  local_8c0 = 0;
  local_8bc = 0;
  local_8b8 = 0;
  local_8b0 = 0;
  Mat::create(in_stack_fffffffffffff130,(int)(in_stack_fffffffffffff128 >> 0x20),
              (int)in_stack_fffffffffffff128,in_stack_fffffffffffff124,in_stack_fffffffffffff120,
              CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118),
              in_stack_fffffffffffff190);
  local_8f4 = local_8a0 * local_8a4;
  if ((local_85c < 2) || (local_85c <= local_8f4)) {
    local_a48 = (void *)0x0;
    local_a40 = (int *)0x0;
    local_a38 = 0;
    local_a30 = 0;
    local_a28 = (long *)0x0;
    local_a20 = 0;
    local_a1c = 0;
    local_a18 = 0;
    local_a14 = 0;
    local_a10 = 0;
    local_a08 = 0;
    Mat::create(in_stack_fffffffffffff140,in_stack_fffffffffffff13c,in_stack_fffffffffffff138,
                (int)((ulong)in_stack_fffffffffffff130 >> 0x20),in_stack_fffffffffffff128,
                (Allocator *)CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120));
    for (local_a4c = 0; iVar2 = (int)((ulong)in_stack_fffffffffffff130 >> 0x20),
        local_a4c < local_8f4; local_a4c = local_a4c + 1) {
      local_a50 = local_a4c / local_8a4;
      local_a54 = local_a4c % local_8a4;
      local_a58 = local_a50 * local_894;
      local_a5c = local_a54 * local_898;
      local_a64 = local_884 - local_a58;
      piVar3 = std::min<int>(&local_a64,&local_894);
      local_a60 = *piVar3;
      local_a6c = local_890[2] - local_a5c;
      piVar3 = std::min<int>(&local_a6c,&local_898);
      local_a68 = *piVar3;
      iVar2 = get_omp_thread_num();
      local_ab8 = (void *)((long)local_a48 + local_a08 * iVar2 * local_a38);
      local_ab0 = (int *)0x0;
      local_aa8 = local_a38;
      local_aa0 = local_a30;
      local_a98 = local_a28;
      local_a8c = local_a1c;
      local_a88 = local_a18;
      local_a84 = 1;
      local_a80 = local_a14;
      local_a78 = ((long)local_a1c * (long)local_a18 * local_a38 + 0xf & 0xfffffffffffffff0) /
                  local_a38;
      local_a90 = local_a20 + -1;
      if (local_a20 == 4) {
        local_a78 = (long)local_a1c * (long)local_a18;
      }
      conv3x3s1_winograd43_transform_input_tile
                (in_stack_000008e8,in_stack_000008e0,in_stack_000008dc,in_stack_000008d8,
                 in_stack_000008d4,in_stack_000008d0,in_stack_fffffffffffff110);
      local_b00 = (void *)((long)local_8f0 +
                          (long)local_8c4 * (long)local_8c0 * (long)(local_a5c / local_898) *
                          local_8e0 + local_8b0 * (local_a58 / local_894) * local_8e0);
      local_ac0 = (long)local_8c4 * (long)local_8c0;
      local_808 = &local_b48;
      local_ac8 = 1;
      local_acc = 1;
      local_ad0 = local_8c0;
      local_ad4 = local_8c4;
      local_ad8 = 2;
      local_ae0 = local_8d0;
      local_ae8 = local_8d8;
      local_af0 = local_8e0;
      local_af8 = (int *)0x0;
      local_b28 = local_8d0;
      local_b48 = 0;
      local_b38 = 0;
      local_b30 = 0;
      local_b20 = 0;
      local_b1c = 0;
      local_b18 = 0;
      local_b14 = 0;
      local_b10 = 0;
      local_b08 = 0;
      local_b40 = 0;
      transpose_pack_B_tile
                (in_stack_fffffffffffff898,in_stack_fffffffffffff890,
                 (int)((ulong)in_stack_fffffffffffff888 >> 0x20),(int)in_stack_fffffffffffff888,
                 in_stack_fffffffffffff884,in_stack_fffffffffffff880);
      local_7f8 = &local_b00;
      if (local_af8 != (int *)0x0) {
        LOCK();
        iVar2 = *local_af8;
        *local_af8 = *local_af8 + -1;
        UNLOCK();
        if (iVar2 == 1) {
          if (local_ae0 == (long *)0x0) {
            if (local_b00 != (void *)0x0) {
              free(local_b00);
            }
          }
          else {
            (**(code **)(*local_ae0 + 0x18))(local_ae0,local_b00);
          }
        }
      }
      local_b00 = (void *)0x0;
      local_af0 = 0;
      local_ae8 = 0;
      local_ad8 = 0;
      local_ad4 = 0;
      local_ad0 = 0;
      local_acc = 0;
      local_ac8 = 0;
      local_ac0 = 0;
      local_af8 = (int *)0x0;
      local_7e8 = &local_ab8;
      if (local_ab0 != (int *)0x0) {
        LOCK();
        iVar2 = *local_ab0;
        *local_ab0 = *local_ab0 + -1;
        UNLOCK();
        if (iVar2 == 1) {
          if (local_a98 == (long *)0x0) {
            if (local_ab8 != (void *)0x0) {
              free(local_ab8);
            }
          }
          else {
            (**(code **)(*local_a98 + 0x18))(local_a98,local_ab8);
          }
        }
      }
      local_ab8 = (void *)0x0;
      local_aa8 = 0;
      local_aa0 = 0;
      local_a90 = 0;
      local_a8c = 0;
      local_a88 = 0;
      local_a84 = 0;
      local_a80 = 0;
      local_a78 = 0;
      local_ab0 = (int *)0x0;
    }
    local_7d8 = &local_a48;
    if (local_a40 != (int *)0x0) {
      LOCK();
      iVar1 = *local_a40;
      *local_a40 = *local_a40 + -1;
      UNLOCK();
      if (iVar1 == 1) {
        if (local_a28 == (long *)0x0) {
          if (local_a48 != (void *)0x0) {
            free(local_a48);
          }
        }
        else {
          (**(code **)(*local_a28 + 0x18))(local_a28,local_a48);
        }
      }
    }
    local_a48 = (void *)0x0;
    local_a38 = 0;
    local_a30 = 0;
    local_a20 = 0;
    local_a1c = 0;
    local_a18 = 0;
    local_a14 = 0;
    local_a10 = 0;
    local_a08 = 0;
    local_a40 = (int *)0x0;
  }
  else {
    local_940 = (void *)0x0;
    local_938 = (int *)0x0;
    local_930 = 0;
    local_928 = 0;
    local_920 = (long *)0x0;
    local_918 = 0;
    local_914 = 0;
    local_910 = 0;
    local_90c = 0;
    local_908 = 0;
    local_900 = 0;
    Mat::create(in_stack_fffffffffffff130,(int)(in_stack_fffffffffffff128 >> 0x20),
                CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120),
                (Allocator *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
    for (local_950 = 0; iVar2 = (int)((ulong)in_stack_fffffffffffff130 >> 0x20),
        local_950 < local_8f4; local_950 = local_950 + 1) {
      local_954 = local_950 / local_8a4;
      local_958 = local_950 % local_8a4;
      local_95c = local_954 * local_894;
      local_960 = local_958 * local_898;
      local_968 = local_884 - local_95c;
      piVar3 = std::min<int>(&local_968,&local_894);
      local_964 = *piVar3;
      local_970 = local_890[2] - local_960;
      piVar3 = std::min<int>(&local_970,&local_898);
      local_96c = *piVar3;
      conv3x3s1_winograd43_transform_input_tile
                (in_stack_000008e8,in_stack_000008e0,in_stack_000008dc,in_stack_000008d8,
                 in_stack_000008d4,in_stack_000008d0,in_stack_fffffffffffff110);
      local_9b8 = (void *)((long)local_8f0 +
                          (long)local_8c4 * (long)local_8c0 * (long)(local_960 / local_898) *
                          local_8e0 + local_8b0 * (local_95c / local_894) * local_8e0);
      local_978 = (long)local_8c4 * (long)local_8c0;
      local_838 = &local_a00;
      local_980 = 1;
      local_984 = 1;
      local_988 = local_8c0;
      local_98c = local_8c4;
      local_990 = 2;
      local_998 = local_8d0;
      local_9a0 = local_8d8;
      local_9a8 = local_8e0;
      local_9b0 = (int *)0x0;
      local_9e0 = local_8d0;
      local_a00 = 0;
      local_9f0 = 0;
      local_9e8 = 0;
      local_9d8 = 0;
      local_9d4 = 0;
      local_9d0 = 0;
      local_9cc = 0;
      local_9c8 = 0;
      local_9c0 = 0;
      local_9f8 = 0;
      transpose_pack_B_tile
                (in_stack_fffffffffffff898,in_stack_fffffffffffff890,
                 (int)((ulong)in_stack_fffffffffffff888 >> 0x20),(int)in_stack_fffffffffffff888,
                 in_stack_fffffffffffff884,in_stack_fffffffffffff880);
      local_828 = &local_9b8;
      if (local_9b0 != (int *)0x0) {
        LOCK();
        iVar2 = *local_9b0;
        *local_9b0 = *local_9b0 + -1;
        UNLOCK();
        if (iVar2 == 1) {
          if (local_998 == (long *)0x0) {
            if (local_9b8 != (void *)0x0) {
              free(local_9b8);
            }
          }
          else {
            (**(code **)(*local_998 + 0x18))(local_998,local_9b8);
          }
        }
      }
      local_9b8 = (void *)0x0;
      local_9a8 = 0;
      local_9a0 = 0;
      local_990 = 0;
      local_98c = 0;
      local_988 = 0;
      local_984 = 0;
      local_980 = 0;
      local_978 = 0;
      local_9b0 = (int *)0x0;
    }
    local_818 = &local_940;
    if (local_938 != (int *)0x0) {
      LOCK();
      iVar1 = *local_938;
      *local_938 = *local_938 + -1;
      UNLOCK();
      if (iVar1 == 1) {
        if (local_920 == (long *)0x0) {
          if (local_940 != (void *)0x0) {
            free(local_940);
          }
        }
        else {
          (**(code **)(*local_920 + 0x18))(local_920,local_940);
        }
      }
    }
    local_940 = (void *)0x0;
    local_930 = 0;
    local_928 = 0;
    local_918 = 0;
    local_914 = 0;
    local_910 = 0;
    local_90c = 0;
    local_908 = 0;
    local_900 = 0;
    local_938 = (int *)0x0;
  }
  local_b90 = (void *)0x0;
  local_b88 = (int *)0x0;
  local_b80 = 0;
  local_b78 = 0;
  local_b70 = (long *)0x0;
  local_b68 = 0;
  local_b64 = 0;
  local_b60 = 0;
  local_b5c = 0;
  local_b58 = 0;
  local_b50 = 0;
  Mat::create(in_stack_fffffffffffff140,in_stack_fffffffffffff13c,in_stack_fffffffffffff138,iVar2,
              in_stack_fffffffffffff128,
              (Allocator *)CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120));
  for (local_b94 = 0; local_b94 < local_89c; local_b94 = local_b94 + 1) {
    local_b98 = local_b94 * local_890[0];
    iVar2 = get_omp_thread_num();
    local_be0 = (void *)((long)local_b90 + local_b50 * iVar2 * local_b80);
    local_bd8 = (int *)0x0;
    local_bd0 = local_b80;
    local_bc8 = local_b78;
    local_bc0 = local_b70;
    local_bb4 = local_b64;
    local_bb0 = local_b60;
    local_bac = 1;
    local_ba8 = local_b5c;
    local_ba0 = ((long)local_b64 * (long)local_b60 * local_b80 + 0xf & 0xfffffffffffffff0) /
                local_b80;
    local_bb8 = local_b68 + -1;
    if (local_b68 == 4) {
      local_ba0 = (long)local_b64 * (long)local_b60;
    }
    local_be8 = local_880 - local_b98;
    piVar3 = std::min<int>(&local_be8,local_890);
    local_be4 = *piVar3;
    for (local_bec = 0; local_bec < local_884; local_bec = local_894 + local_bec) {
      local_bf4 = local_884 - local_bec;
      piVar3 = std::min<int>(&local_bf4,&local_894);
      local_bf0 = *piVar3;
      for (local_bf8 = 0; local_bf8 < local_890[2]; local_bf8 = local_898 + local_bf8) {
        local_c00 = local_890[2] - local_bf8;
        piVar3 = std::min<int>(&local_c00,&local_898);
        in_stack_fffffffffffff110 = *piVar3;
        local_c1c = *(int *)((long)local_850 + 0x2c);
        local_c18 = (int)local_850[6];
        local_c38 = local_850[2];
        local_c30 = (undefined4)local_850[3];
        local_c70 = (long *)local_850[4];
        local_c48 = (void *)(*local_850 +
                             local_850[8] * (long)(local_b98 / local_890[0]) * local_850[2] +
                            (long)local_c1c * (long)local_c18 * (long)(local_bf8 / local_898) *
                            local_c38);
        local_c08 = (long)local_c1c * (long)local_c18;
        local_7c8 = &local_c90;
        local_cd8 = (void *)((long)local_8f0 +
                            (long)local_8c4 * (long)local_8c0 * (long)(local_bf8 / local_898) *
                            local_8e0 + local_8b0 * (local_bec / local_894) * local_8e0);
        local_c98 = (long)local_8c4 * (long)local_8c0;
        local_7b8 = &local_d20;
        local_c10 = 1;
        local_c14 = 1;
        local_c20 = 2;
        local_c40 = (int *)0x0;
        local_c58 = 0;
        local_c5c = 0;
        local_c60 = 0;
        local_c64 = 0;
        local_c78 = 0;
        local_c80 = 0;
        local_c88 = 0;
        local_c90 = 0;
        local_ca0 = 1;
        local_ca4 = 1;
        local_ca8 = local_8c0;
        local_cac = local_8c4;
        local_cb0 = 2;
        local_cb8 = local_8d0;
        local_cc0 = local_8d8;
        local_cc8 = local_8e0;
        local_cd0 = (int *)0x0;
        local_d00 = local_8d0;
        local_c50 = 0;
        local_c68 = 0;
        local_d20 = 0;
        local_d10 = 0;
        local_d08 = 0;
        local_cf8 = 0;
        local_cf4 = 0;
        local_cf0 = 0;
        local_cec = 0;
        local_ce8 = 0;
        local_ce0 = 0;
        local_d18 = 0;
        local_bfc = in_stack_fffffffffffff110;
        local_c28 = local_c70;
        gemm_transB_packed_tile
                  (_max_jj_1,_max_kk_1,in_stack_00000488,B_tile_1.cstep._4_4_,(int)B_tile_1.cstep,
                   B_tile_1._60_4_,in_stack_fffffffffffff110,in_stack_fffffffffffff118);
        local_7a8 = &local_cd8;
        if (local_cd0 != (int *)0x0) {
          LOCK();
          iVar2 = *local_cd0;
          *local_cd0 = *local_cd0 + -1;
          UNLOCK();
          if (iVar2 == 1) {
            if (local_cb8 == (long *)0x0) {
              if (local_cd8 != (void *)0x0) {
                free(local_cd8);
              }
            }
            else {
              (**(code **)(*local_cb8 + 0x18))(local_cb8,local_cd8);
            }
          }
        }
        local_cd8 = (void *)0x0;
        local_cc8 = 0;
        local_cc0 = 0;
        local_cb0 = 0;
        local_cac = 0;
        local_ca8 = 0;
        local_ca4 = 0;
        local_ca0 = 0;
        local_c98 = 0;
        local_cd0 = (int *)0x0;
        local_798 = &local_c48;
        if (local_c40 != (int *)0x0) {
          LOCK();
          iVar2 = *local_c40;
          *local_c40 = *local_c40 + -1;
          UNLOCK();
          if (iVar2 == 1) {
            if (local_c28 == (long *)0x0) {
              if (local_c48 != (void *)0x0) {
                free(local_c48);
              }
            }
            else {
              (**(code **)(*local_c28 + 0x18))(local_c28,local_c48);
            }
          }
        }
        local_c48 = (void *)0x0;
        local_c38 = 0;
        local_c30 = 0;
        local_c20 = 0;
        local_c1c = 0;
        local_c18 = 0;
        local_c14 = 0;
        local_c10 = 0;
        local_c08 = 0;
        local_c40 = (int *)0x0;
      }
      conv3x3s1_winograd43_transform_output_tile
                ((Mat *)B_tileX._24_8_,(Mat *)B_tileX.elemsize,(Mat *)B_tileX.refcount,
                 B_tileX.data._4_4_,(int)B_tileX.data,ppjk_1,in_stack_fffffffffffff110);
    }
    ppvVar4 = &local_be0;
    local_788 = ppvVar4;
    if (local_bd8 != (int *)0x0) {
      LOCK();
      iVar2 = *local_bd8;
      *local_bd8 = *local_bd8 + -1;
      UNLOCK();
      if (iVar2 == 1) {
        if (local_bc0 == (long *)0x0) {
          if (local_be0 != (void *)0x0) {
            free(local_be0);
          }
        }
        else {
          (**(code **)(*local_bc0 + 0x18))(local_bc0,local_be0);
        }
      }
    }
    *ppvVar4 = (void *)0x0;
    ppvVar4[2] = (void *)0x0;
    *(undefined4 *)(ppvVar4 + 3) = 0;
    *(undefined4 *)(ppvVar4 + 5) = 0;
    *(undefined4 *)((long)ppvVar4 + 0x2c) = 0;
    *(undefined4 *)(ppvVar4 + 6) = 0;
    *(undefined4 *)((long)ppvVar4 + 0x34) = 0;
    *(undefined4 *)(ppvVar4 + 7) = 0;
    ppvVar4[8] = (void *)0x0;
    ppvVar4[1] = (void *)0x0;
  }
  ppvVar4 = &local_b90;
  if (local_b88 != (int *)0x0) {
    LOCK();
    iVar2 = *local_b88;
    *local_b88 = *local_b88 + -1;
    UNLOCK();
    if (iVar2 == 1) {
      if (local_b70 == (long *)0x0) {
        if (local_b90 != (void *)0x0) {
          free(local_b90);
        }
      }
      else {
        (**(code **)(*local_b70 + 0x18))(local_b70,local_b90);
      }
    }
  }
  *ppvVar4 = (void *)0x0;
  ppvVar4[2] = (void *)0x0;
  *(undefined4 *)(ppvVar4 + 3) = 0;
  *(undefined4 *)(ppvVar4 + 5) = 0;
  *(undefined4 *)((long)ppvVar4 + 0x2c) = 0;
  *(undefined4 *)(ppvVar4 + 6) = 0;
  *(undefined4 *)((long)ppvVar4 + 0x34) = 0;
  *(undefined4 *)(ppvVar4 + 7) = 0;
  ppvVar4[8] = (void *)0x0;
  ppvVar4[1] = (void *)0x0;
  ppvVar4 = &local_8f0;
  if (local_8e8 != (int *)0x0) {
    LOCK();
    iVar2 = *local_8e8;
    *local_8e8 = *local_8e8 + -1;
    UNLOCK();
    if (iVar2 == 1) {
      if (local_8d0 == (long *)0x0) {
        if (local_8f0 != (void *)0x0) {
          free(local_8f0);
        }
      }
      else {
        (**(code **)(*local_8d0 + 0x18))(local_8d0,local_8f0);
      }
    }
  }
  *ppvVar4 = (void *)0x0;
  ppvVar4[2] = (void *)0x0;
  *(undefined4 *)(ppvVar4 + 3) = 0;
  *(undefined4 *)(ppvVar4 + 5) = 0;
  *(undefined4 *)((long)ppvVar4 + 0x2c) = 0;
  *(undefined4 *)(ppvVar4 + 6) = 0;
  *(undefined4 *)((long)ppvVar4 + 0x34) = 0;
  *(undefined4 *)(ppvVar4 + 7) = 0;
  ppvVar4[8] = (void *)0x0;
  ppvVar4[1] = (void *)0x0;
  return;
}

Assistant:

static void conv3x3s1_winograd43(const Mat& bottom_blob, Mat& top_blob, const Mat& AT, const Mat& bias, int nT, const Option& opt)
{
    int outw = top_blob.w;
    int outh = top_blob.h;

    // pad to 4n+2, winograd F(4,3)
    int w_tiles = (outw + 3) / 4;
    int h_tiles = (outh + 3) / 4;
    int tiles = w_tiles * h_tiles;

    const int M = top_blob.c * top_blob.elempack;
    const int N = tiles;
    const int K = bottom_blob.c * bottom_blob.elempack;
    const int B = 36;

    // NCNN_LOGE("conv3x3s1_winograd43 %d %d %d", M, N, K);

    int TILE_M, TILE_N, TILE_K;
    get_optimal_tile_mnk(M, N, K, TILE_M, TILE_N, TILE_K, nT);

    const int nn_M = (M + TILE_M - 1) / TILE_M;
    const int nn_N = (N + TILE_N - 1) / TILE_N;
    const int nn_K = (K + TILE_K - 1) / TILE_K;

    // NCNN_LOGE("TILE M/N/K = %d %d %d -> %d %d %d", M, N, K, TILE_M, TILE_N, TILE_K);

    Mat BT(TILE_K * TILE_N, B, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 4u, opt.workspace_allocator);

    const int nn_NK = nn_N * nn_K;

    if (nT > 1 && nn_NK < nT)
    {
        Mat B_tile(TILE_N * B * TILE_K, 4u, opt.workspace_allocator);

        for (int ppjk = 0; ppjk < nn_NK; ppjk++)
        {
            const int ppj = ppjk / nn_K;
            const int ppk = ppjk % nn_K;

            const int j = ppj * TILE_N;
            const int k = ppk * TILE_K;

            const int max_jj = std::min((N - j), TILE_N);
            const int max_kk = std::min((K - k), TILE_K);

            // transform input
            conv3x3s1_winograd43_transform_input_tile(bottom_blob, B_tile, j, max_jj, k, max_kk, nT);

            Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

            transpose_pack_B_tile(B_tile, BT_tile, B, max_jj, max_kk, nT);
        }
    }
    else
    {
        Mat B_tileX(TILE_N * B * TILE_K, 1, nT, 4u, opt.workspace_allocator);

        #pragma omp parallel for num_threads(nT)
        for (int ppjk = 0; ppjk < nn_NK; ppjk++)
        {
            const int ppj = ppjk / nn_K;
            const int ppk = ppjk % nn_K;

            const int j = ppj * TILE_N;
            const int k = ppk * TILE_K;

            const int max_jj = std::min((N - j), TILE_N);
            const int max_kk = std::min((K - k), TILE_K);

            Mat B_tile = B_tileX.channel(get_omp_thread_num());

            // transform input
            conv3x3s1_winograd43_transform_input_tile(bottom_blob, B_tile, j, max_jj, k, max_kk, 1);

            Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

            transpose_pack_B_tile(B_tile, BT_tile, B, max_jj, max_kk, 1);
        }
    }

    Mat top_tileX(TILE_N * B * TILE_M, 1, nT, 4u, opt.workspace_allocator);

    #pragma omp parallel for num_threads(nT)
    for (int ppj = 0; ppj < nn_M; ppj++)
    {
        const int i = ppj * TILE_M;

        Mat top_tile = top_tileX.channel(get_omp_thread_num());

        const int max_ii = std::min((M - i), TILE_M);

        for (int j = 0; j < N; j += TILE_N)
        {
            const int max_jj = std::min((N - j), TILE_N);

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_kk = std::min((K - k), TILE_K);

                const Mat AT_tile = AT.channel(i / TILE_M).depth(k / TILE_K);

                const Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

                gemm_transB_packed_tile(AT_tile, BT_tile, top_tile, B, max_ii, max_jj, k, max_kk);
            }

            // transform output
            conv3x3s1_winograd43_transform_output_tile(top_tile, top_blob, bias, i, max_ii, j, max_jj);
        }
    }
}